

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyMesh::LoadStateIncrement
          (ChLoadBodyMesh *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  int iVar14;
  Index size;
  pointer psVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ChState mx;
  ChState mx_inc;
  ChStateDelta mDi;
  int local_cc;
  ChState local_b0;
  ChState local_98;
  double *local_80;
  ulong local_78;
  ChStateDelta *local_68;
  ulong local_60;
  long local_50;
  ChStateDelta local_48;
  
  psVar15 = (this->forces).
            super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->forces).
      super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar15) {
    uVar18 = 0;
    iVar22 = 0;
    local_cc = 0;
    do {
      iVar13 = (*((psVar15[uVar18].
                   super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj[6])();
      ChState::ChState(&local_98,(long)iVar13,(ChIntegrable *)0x0);
      iVar13 = (**(code **)(*(long *)&((this->forces).
                                       super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                       super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChLoadCustom + 0x30))();
      ChState::ChState(&local_b0,(long)iVar13,(ChIntegrable *)0x0);
      iVar13 = (**(code **)(*(long *)&((this->forces).
                                       super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                       super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChLoadCustom + 0x38))();
      ChStateDelta::ChStateDelta(&local_48,(long)iVar13,(ChIntegrable *)0x0);
      uVar19 = (ulong)iVar22;
      pdVar3 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar4 = (x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_80 = pdVar3 + uVar19;
      local_78 = local_b0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (local_b0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
          pdVar3 != (double *)0x0) {
LAB_005d1542:
        pcVar17 = 
        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
        ;
LAB_005d158d:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar17);
      }
      local_68 = (ChStateDelta *)x;
      local_60 = uVar19;
      local_50 = lVar4;
      if (((long)(local_b0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows |
                 uVar19) < 0) ||
         (lVar4 - local_b0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)uVar19)) {
LAB_005d152b:
        pcVar17 = 
        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
LAB_005d156e:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar17);
      }
      ChState::operator=(&local_b0,
                         (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_80);
      uVar16 = (ulong)local_cc;
      pdVar3 = (dw->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar4 = (dw->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_80 = pdVar3 + uVar16;
      local_78 = local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (local_48.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
          pdVar3 != (double *)0x0) goto LAB_005d1542;
      local_68 = dw;
      local_60 = uVar16;
      local_50 = lVar4;
      if (((long)(local_48.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows |
                 uVar16) < 0) ||
         (lVar4 - local_48.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)uVar16)) goto LAB_005d152b;
      ChStateDelta::operator=
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_80);
      peVar5 = (this->forces).
               super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)&peVar5->super_ChLoadCustom + 0x50))
                (peVar5,&local_b0,&local_48,&local_98);
      pdVar3 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (local_98.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
          pdVar3 != (double *)0x0) {
        pcVar17 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_005d158d;
      }
      if (((long)(local_98.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows |
                 uVar19) < 0) ||
         ((x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
          local_98.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)uVar19)) {
        pcVar17 = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_005d156e;
      }
      pdVar3 = pdVar3 + uVar19;
      uVar19 = local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar19 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
         local_98.super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
         (long)uVar19)) {
        uVar19 = local_98.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar20 = local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
               uVar19;
      uVar16 = uVar20 + 7;
      if (-1 < (long)uVar20) {
        uVar16 = uVar20;
      }
      if (0 < (long)uVar19) {
        uVar21 = 0;
        do {
          pdVar3[uVar21] =
               local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      uVar16 = (uVar16 & 0xfffffffffffffff8) + uVar19;
      if (7 < (long)uVar20) {
        do {
          pdVar1 = local_98.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar19;
          dVar6 = pdVar1[1];
          dVar7 = pdVar1[2];
          dVar8 = pdVar1[3];
          dVar9 = pdVar1[4];
          dVar10 = pdVar1[5];
          dVar11 = pdVar1[6];
          dVar12 = pdVar1[7];
          pdVar2 = pdVar3 + uVar19;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar6;
          pdVar2[2] = dVar7;
          pdVar2[3] = dVar8;
          pdVar2[4] = dVar9;
          pdVar2[5] = dVar10;
          pdVar2[6] = dVar11;
          pdVar2[7] = dVar12;
          uVar19 = uVar19 + 8;
        } while ((long)uVar19 < (long)uVar16);
      }
      if ((long)uVar16 <
          local_98.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          pdVar3[uVar16] =
               local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [uVar16];
          uVar16 = uVar16 + 1;
        } while (local_98.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                 uVar16);
      }
      iVar13 = (**(code **)(*(long *)&((this->forces).
                                       super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                       super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChLoadCustom + 0x30))();
      iVar14 = (**(code **)(*(long *)&((this->forces).
                                       super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                       super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChLoadCustom + 0x38))();
      if (local_48.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_48.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_b0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_b0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_98.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_98.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      psVar15 = (this->forces).
                super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_cc = local_cc + iVar14;
      iVar22 = iVar22 + iVar13;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)(this->forces).
                                    super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar15 >> 4)
            );
  }
  return;
}

Assistant:

void ChLoadBodyMesh::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    int ndoftotx = 0;
    int ndoftotw = 0;
    for (int i = 0; i < forces.size(); ++i) {
        ChState mx_inc(forces[i]->LoadGet_ndof_x(), nullptr);
        ChState mx(forces[i]->LoadGet_ndof_x(), nullptr);
        ChStateDelta mDi(forces[i]->LoadGet_ndof_w(), nullptr);
        mx = x.segment(ndoftotx, mx.size());
        mDi = dw.segment(ndoftotw, mDi.size());
        forces[i]->LoadStateIncrement(mx, mDi, mx_inc);
        x_new.segment(ndoftotx, mx_inc.size()) = mx_inc;
        ndoftotx += forces[i]->LoadGet_ndof_x();
        ndoftotw += forces[i]->LoadGet_ndof_w();
    }
}